

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::emit_block_hints(CompilerGLSL *this,SPIRBlock *block)

{
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  SPIRBlock *local_18;
  SPIRBlock *block_local;
  CompilerGLSL *this_local;
  
  if (((((this->options).es & 1U) == 0) || (0x135 < (this->options).version)) &&
     ((((this->options).es & 1U) != 0 || (0x8b < (this->options).version)))) {
    local_18 = block;
    block_local = (SPIRBlock *)this;
    switch(block->hint) {
    case HintUnroll:
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_98,"GL_EXT_control_flow_attributes",&local_99)
      ;
      require_extension_internal(this,&local_98);
      ::std::__cxx11::string::~string((string *)&local_98);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_99);
      statement<char_const(&)[19]>(this,(char (*) [19])0x4a77d0);
      break;
    case HintDontUnroll:
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_c0,"GL_EXT_control_flow_attributes",&local_c1)
      ;
      require_extension_internal(this,&local_c0);
      ::std::__cxx11::string::~string((string *)&local_c0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      statement<char_const(&)[17]>(this,(char (*) [17])0x4a77eb);
      break;
    case HintFlatten:
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_38,"GL_EXT_control_flow_attributes",&local_39)
      ;
      require_extension_internal(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
      statement<char_const(&)[20]>(this,(char (*) [20])0x4a7799);
      break;
    case HintDontFlatten:
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_70,"GL_EXT_control_flow_attributes",&local_71)
      ;
      require_extension_internal(this,&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
      statement<char_const(&)[19]>(this,(char (*) [19])0x4a77b5);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::emit_block_hints(const SPIRBlock &block)
{
	if ((options.es && options.version < 310) || (!options.es && options.version < 140))
		return;

	switch (block.hint)
	{
	case SPIRBlock::HintFlatten:
		require_extension_internal("GL_EXT_control_flow_attributes");
		statement("SPIRV_CROSS_FLATTEN");
		break;
	case SPIRBlock::HintDontFlatten:
		require_extension_internal("GL_EXT_control_flow_attributes");
		statement("SPIRV_CROSS_BRANCH");
		break;
	case SPIRBlock::HintUnroll:
		require_extension_internal("GL_EXT_control_flow_attributes");
		statement("SPIRV_CROSS_UNROLL");
		break;
	case SPIRBlock::HintDontUnroll:
		require_extension_internal("GL_EXT_control_flow_attributes");
		statement("SPIRV_CROSS_LOOP");
		break;
	default:
		break;
	}
}